

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

string * __thiscall
t_rs_generator::rust_sync_service_call_invocation
          (string *__return_storage_ptr__,t_rs_generator *this,t_function *tfunc,
          string *field_prefix)

{
  t_struct *tstruct;
  ostringstream func_args;
  string local_1c0;
  ostream local_1a0;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  std::operator<<(&local_1a0,"(");
  tstruct = tfunc->arglist_;
  if ((tstruct != (t_struct *)0x0) &&
     ((tstruct->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (tstruct->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    struct_to_invocation(&local_1c0,this,tstruct,field_prefix);
    std::operator<<(&local_1a0,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
  }
  std::operator<<(&local_1a0,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::rust_sync_service_call_invocation(t_function* tfunc, const string& field_prefix) {
  ostringstream func_args;
  func_args << "(";

  if (has_args(tfunc)) {
    func_args << struct_to_invocation(tfunc->get_arglist(), field_prefix);
  }

  func_args << ")";
  return func_args.str();
}